

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O2

char * toLocalFormat(char *name)

{
  byte bVar1;
  byte *ptr;
  byte *pbVar2;
  uint uVar4;
  bool bVar5;
  byte *pbVar3;
  
  ptr = (byte *)malloc(0x100);
  checkMalloc(ptr);
  pbVar2 = ptr;
  while (bVar1 = *name, bVar1 != 0) {
    uVar4 = (uint)bVar1;
    pbVar3 = pbVar2;
    if ((char)bVar1 < '\x01') {
      uVar4 = 0;
    }
    while( true ) {
      pbVar2 = pbVar3 + 1;
      name = (char *)((byte *)name + 1);
      bVar5 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      if (bVar5) break;
      *pbVar3 = *name;
      pbVar3 = pbVar2;
    }
    *pbVar3 = 0x2e;
  }
  pbVar2[-1] = 0;
  return (char *)ptr;
}

Assistant:

char *toLocalFormat(char *name)
{

    char *result = (char *) malloc(256);
    checkMalloc(result);
    char *ptr = result;
    while (*name)
    {
        int p = *name++;
        for (int j = 0; j < (int) p; ++j)
        {

            *ptr++ = *name++;
        }
        *ptr++ = '.';
    }
    *--ptr = '\0';
    return result;
}